

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O1

void __thiscall
embree::barrier_sys_regression_test::barrier_sys_regression_test(barrier_sys_regression_test *this)

{
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"barrier_sys_regression_test","");
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_002cf3d8
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,local_48,local_48 + local_40);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_002cf398;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threadID).super___atomic_base<unsigned_long>._M_i = 0;
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  registerRegressionTest((RegressionTest *)0x1de7d4);
  return;
}

Assistant:

barrier_sys_regression_test() 
      : RegressionTest("barrier_sys_regression_test"), threadID(0), numFailed(0)
    {
      registerRegressionTest(this);
    }